

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  secp256k1_scalar *in_RCX;
  secp256k1_context *in_RDX;
  long in_RSI;
  long in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar *in_stack_00000050;
  secp256k1_scalar *in_stack_00000058;
  size_t *in_stack_00000060;
  uchar *in_stack_00000068;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffffc8;
  secp256k1_callback *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x1a5,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_context *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  else if (in_RCX == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  else {
    secp256k1_ecdsa_signature_load
              (in_RDX,in_RCX,(secp256k1_scalar *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
              );
    local_4 = secp256k1_ecdsa_sig_serialize
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}